

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O3

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* Tile<Color>::generate_action_map
            (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,Symmetry *symmetry)

{
  long lVar1;
  undefined1 auVar2 [16];
  pointer puVar3;
  pointer pvVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_type __n;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rotation_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reflection_map;
  allocator_type local_6a;
  allocator_type local_69;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  generate_rotation_map(&local_68,symmetry);
  generate_reflection_map(&local_38,symmetry);
  puVar3 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__n,&local_69);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__,8,&local_50,&local_6a);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  auVar2 = _DAT_00126060;
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar3) {
    lVar9 = __n + (__n == 0);
  }
  else {
    lVar9 = __n + (__n == 0);
    lVar1 = *(long *)&(((__return_storage_ptr__->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data;
    lVar6 = lVar9 + -1;
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar10 = auVar10 ^ _DAT_00126060;
    auVar11 = _DAT_00126050;
    do {
      auVar12 = auVar11 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        *(int *)(lVar1 + uVar5 * 4) = (int)uVar5;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        *(int *)(lVar1 + 4 + uVar5 * 4) = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar6 + 2;
    } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar5);
  }
  pvVar4 = (__return_storage_ptr__->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = 1;
LAB_001251f4:
  do {
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      lVar1 = *(long *)&pvVar4[lVar6 + -1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar7 = *(long *)&pvVar4[lVar6].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = 0;
      do {
        *(uint *)(lVar7 + lVar8 * 4) =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*(uint *)(lVar1 + lVar8 * 4)];
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
      lVar6 = lVar6 + 1;
      if (lVar6 != 4) goto LAB_001251f4;
      pvVar4 = (__return_storage_ptr__->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar3) goto LAB_00125264;
      lVar6 = *(long *)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data;
      lVar1 = *(long *)&pvVar4[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data;
      lVar7 = 0;
      do {
        *(uint *)(lVar1 + lVar7 * 4) =
             local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*(uint *)(lVar6 + lVar7 * 4)];
        lVar7 = lVar7 + 1;
      } while (lVar9 != lVar7);
LAB_00125261:
      pvVar4 = (__return_storage_ptr__->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
LAB_00125264:
      lVar6 = 5;
      do {
        if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar3) {
          lVar1 = *(long *)&pvVar4[lVar6 + -1].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
          lVar7 = *(long *)&pvVar4[lVar6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
          lVar8 = 0;
          do {
            *(uint *)(lVar7 + lVar8 * 4) =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[*(uint *)(lVar1 + lVar8 * 4)];
            lVar8 = lVar8 + 1;
          } while (lVar9 != lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) goto LAB_00125261;
  } while( true );
}

Assistant:

static std::vector<std::vector<unsigned>>
		generate_action_map(const Symmetry &symmetry) noexcept {
		std::vector<unsigned> rotation_map = generate_rotation_map(symmetry);
		std::vector<unsigned> reflection_map = generate_reflection_map(symmetry);
		size_t size = rotation_map.size();
		std::vector<std::vector<unsigned>> action_map(8,
			std::vector<unsigned>(size));
		for (size_t i = 0; i < size; ++i) {
			action_map[0][i] = i;
		}

		for (size_t a = 1; a < 4; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		for (size_t i = 0; i < size; ++i) {
			action_map[4][i] = reflection_map[action_map[0][i]];
		}
		for (size_t a = 5; a < 8; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		return action_map;
	}